

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in1;
  Type in0;
  undefined1 local_6c [32];
  Vector<float,_3> local_4c;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)(local_6c + 0x10),(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)(local_6c + 0x10),
               (float *)sr::(anonymous_namespace)::s_constInMat2x2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)local_6c,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_6c,
               (float *)(sr::(anonymous_namespace)::s_constInMat2x2 + 0x10));
  }
  tcu::operator/((tcu *)&local_40,(Matrix<float,_2,_2> *)(local_6c + 0x10),
                 (Matrix<float,_2,_2> *)local_6c);
  local_4c.m_data[2] = local_3c + local_34;
  local_4c.m_data[0] = local_40;
  local_4c.m_data[1] = local_38;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_4c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}